

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O0

int poptSaveBits(poptBits *bitsp,uint argInfo,char *s)

{
  char *s_00;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  int local_44;
  char *pcStack_40;
  int rc;
  char *te;
  char *t;
  char *tbuf;
  char *s_local;
  uint argInfo_local;
  poptBits *bitsp_local;
  
  local_44 = 0;
  if ((((bitsp == (poptBits *)0x0) || (s == (char *)0x0)) || (*s == '\0')) ||
     (iVar1 = _poptBitsNew(bitsp), iVar1 != 0)) {
    bitsp_local._4_4_ = -0x14;
  }
  else {
    sVar2 = strlen(s);
    pcVar3 = (char *)malloc(sVar2 + 1);
    if (pcVar3 == (char *)0x0) {
      fprintf(_stderr,"virtual memory exhausted.\n");
      exit(1);
    }
    pcVar3 = strcpy(pcVar3,s);
    pcStack_40 = pcVar3;
    do {
      do {
        s_00 = pcStack_40;
        bVar4 = false;
        if (pcStack_40 != (char *)0x0) {
          bVar4 = *pcStack_40 != '\0';
        }
        if (!bVar4) goto LAB_0010350b;
        while( true ) {
          bVar4 = false;
          if (*pcStack_40 != '\0') {
            bVar4 = *pcStack_40 != ',';
          }
          if (!bVar4) break;
          pcStack_40 = pcStack_40 + 1;
        }
        if (*pcStack_40 != '\0') {
          *pcStack_40 = '\0';
          pcStack_40 = pcStack_40 + 1;
        }
      } while (*s_00 == '\0');
      if (*s_00 == '!') {
        local_44 = poptBitsChk(*bitsp,s_00 + 1);
        if (0 < local_44) {
          local_44 = poptBitsDel(*bitsp,s_00 + 1);
        }
      }
      else {
        local_44 = poptBitsAdd(*bitsp,s_00);
      }
    } while (local_44 == 0);
LAB_0010350b:
    _free(pcVar3);
    bitsp_local._4_4_ = local_44;
  }
  return bitsp_local._4_4_;
}

Assistant:

int poptSaveBits(poptBits * bitsp,
		UNUSED(unsigned int argInfo), const char * s)
{
    char *tbuf = NULL;
    char *t, *te;
    int rc = 0;

    if (bitsp == NULL || s == NULL || *s == '\0' || _poptBitsNew(bitsp))
	return POPT_ERROR_NULLARG;

    /* Parse comma separated attributes. */
    te = tbuf = xstrdup(s);
    while ((t = te) != NULL && *t) {
	while (*te != '\0' && *te != ',')
	    te++;
	if (*te != '\0')
	    *te++ = '\0';
	/* XXX Ignore empty strings. */
	if (*t == '\0')
	    continue;
	/* XXX Permit negated attributes. caveat emptor: false negatives. */
	if (*t == '!') {
	    t++;
	    if ((rc = poptBitsChk(*bitsp, t)) > 0)
		rc = poptBitsDel(*bitsp, t);
	} else
	    rc = poptBitsAdd(*bitsp, t);
	if (rc)
	    break;
    }
    tbuf = _free(tbuf);
    return rc;
}